

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImDrawList *pIVar3;
  ImGuiWindow *this;
  ImFont *font;
  char *text_begin;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ImGuiWindow *pIVar16;
  ImU32 IVar17;
  ulong uVar18;
  ulong uVar19;
  char *text_end;
  uint uVar20;
  ImVec2 IVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [56];
  undefined1 auVar25 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ImRect IVar34;
  ImVec4 local_c8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  ImVec2 IStack_98;
  ImRect *local_90;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  ImVec2 *local_48;
  ImDrawList *local_40;
  ImGuiWindow *local_38;
  undefined1 auVar30 [56];
  
  IVar21 = (ImVec2)GImGui;
  local_38 = GImGui->CurrentWindow;
  local_58 = (bb->Min).x;
  fStack_54 = (bb->Min).y;
  uStack_50 = 0;
  _fStack_70 = 0;
  local_78._0_4_ = (bb->Max).x;
  local_78._4_4_ = (bb->Max).y;
  local_68 = (viewport->super_ImGuiViewport).Pos;
  uStack_60 = 0;
  _fStack_80 = 0;
  local_88._0_4_ = (viewport->super_ImGuiViewport).Size.x;
  local_88._4_4_ = (viewport->super_ImGuiViewport).Size.y;
  pIVar3 = local_38->DrawList;
  local_c8.x = (GImGui->Style).Colors[5].x;
  local_c8.y = (GImGui->Style).Colors[5].y;
  uVar5 = (GImGui->Style).Colors[5].z;
  uVar6 = (GImGui->Style).Colors[5].w;
  local_c8.w = (GImGui->Style).Alpha * 0.4 * (float)uVar6;
  local_c8.z = (float)uVar5;
  local_40 = draw_list;
  IVar17 = ColorConvertFloat4ToU32(&local_c8);
  local_90 = bb;
  local_48 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar3,&bb->Min,&bb->Max,IVar17,0.0,0xf);
  uVar20 = (((ImGuiContext *)IVar21)->Windows).Size;
  uVar18 = (ulong)uVar20;
  if (uVar20 != 0) {
    auVar4._4_4_ = fStack_54;
    auVar4._0_4_ = local_58;
    auVar4._8_8_ = uStack_50;
    auVar22 = vsubps_avx(_local_78,auVar4);
    _local_78 = vdivps_avx(auVar22,_local_88);
    auVar22._0_4_ = local_78._0_4_ * local_68.x;
    auVar22._4_4_ = local_78._4_4_ * local_68.y;
    auVar22._8_4_ = local_78._8_4_ * (float)uStack_60;
    auVar22._12_4_ = local_78._12_4_ * uStack_60._4_4_;
    _local_88 = vsubps_avx(auVar4,auVar22);
    uVar19 = 0;
    local_68 = IVar21;
    do {
      if ((long)(int)uVar18 <= (long)uVar19) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      this = (*(ImGuiWindow ***)((long)IVar21 + 0x1a90))[uVar19];
      if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
        IVar2 = this->Pos;
        auVar23._8_8_ = 0;
        auVar23._0_4_ = IVar2.x;
        auVar23._4_4_ = IVar2.y;
        auVar27._0_4_ = IVar2.x + (this->Size).x;
        auVar27._4_4_ = IVar2.y + (this->Size).y;
        auVar27._8_8_ = 0;
        auVar30 = ZEXT856(0);
        local_b0 = vmovlhps_avx(auVar23,auVar27);
        auVar26 = ZEXT856(local_b0._8_8_);
        IVar34 = ImGuiWindow::TitleBarRect(this);
        pIVar16 = local_38;
        auVar29._0_8_ = IVar34.Max;
        auVar29._8_56_ = auVar30;
        auVar25._0_8_ = IVar34.Min;
        auVar25._8_56_ = auVar26;
        auVar22 = vmovlhps_avx(auVar25._0_16_,auVar29._0_16_);
        auVar28._0_4_ = (int)((float)local_88._0_4_ + (float)local_78._0_4_ * local_b0._0_4_);
        auVar28._4_4_ = (int)((float)local_88._4_4_ + (float)local_78._4_4_ * local_b0._4_4_);
        auVar28._8_4_ = (int)(fStack_80 + fStack_70 * 0.0);
        auVar28._12_4_ = (int)(fStack_7c + fStack_6c * 0.0);
        auVar4 = vcvtdq2ps_avx(auVar28);
        auVar31._0_4_ = (int)((float)local_88._0_4_ + (float)local_78._0_4_ * local_b0._8_4_);
        auVar31._4_4_ = (int)((float)local_88._4_4_ + (float)local_78._4_4_ * local_b0._12_4_);
        auVar31._8_4_ = (int)(fStack_80 + fStack_70 * 0.0);
        auVar31._12_4_ = (int)(fStack_7c + fStack_6c * 0.0);
        auVar23 = vcvtdq2ps_avx(auVar31);
        vmovlhps_avx(auVar4,auVar23);
        auVar24._0_4_ = (int)((float)local_88._0_4_ + (float)local_78._0_4_ * IVar34.Min.x);
        auVar24._4_4_ = (int)((float)local_88._4_4_ + (float)local_78._4_4_ * IVar34.Min.y);
        auVar24._8_4_ = (int)(fStack_80 + fStack_70 * auVar26._0_4_);
        auVar24._12_4_ = (int)(fStack_7c + fStack_6c * auVar26._4_4_);
        auVar24 = vcvtdq2ps_avx(auVar24);
        IStack_98.x = auVar22._8_4_;
        auVar22 = vcvtdq2ps_avx(ZEXT416((uint)(int)((float)local_88._0_4_ +
                                                   (float)local_78._0_4_ * IStack_98.x)));
        auVar27 = vmovshdup_avx(auVar24);
        auVar27 = vinsertps_avx(auVar22,ZEXT416((uint)(auVar27._0_4_ + 5.0)),0x1c);
        vmovlhps_avx(auVar24,auVar27);
        auVar32._8_8_ = 0;
        auVar32._0_4_ = (local_90->Min).x;
        auVar32._4_4_ = (local_90->Min).y;
        auVar33._8_8_ = 0;
        auVar33._0_4_ = (local_90->Max).x;
        auVar33._4_4_ = (local_90->Max).y;
        auVar22 = vcmpps_avx(auVar4,auVar32,1);
        auVar4 = vminps_avx(auVar33,auVar4);
        auVar22 = vblendvps_avx(auVar4,auVar32,auVar22);
        auVar4 = vcmpps_avx(auVar23,auVar32,1);
        auVar23 = vminps_avx(auVar33,auVar23);
        auVar4 = vblendvps_avx(auVar23,auVar32,auVar4);
        local_b0 = vmovlhps_avx(auVar22,auVar4);
        auVar22 = vcmpps_avx(auVar24,auVar32,1);
        auVar4 = vminps_avx(auVar33,auVar24);
        auVar22 = vblendvps_avx(auVar4,auVar32,auVar22);
        auVar4 = vcmpps_avx(auVar27,auVar32,1);
        auVar23 = vminps_avx(auVar33,auVar27);
        auVar4 = vblendvps_avx(auVar23,auVar32,auVar4);
        _local_a0 = vmovlhps_avx(auVar22,auVar4);
        if (*(ImGuiWindow **)((long)IVar21 + 0x1ca0) == (ImGuiWindow *)0x0) {
          uVar20 = 10;
        }
        else {
          uVar20 = this->RootWindowForTitleBarHighlight ==
                   (*(ImGuiWindow **)((long)IVar21 + 0x1ca0))->RootWindowForTitleBarHighlight | 10;
        }
        pIVar3 = local_38->DrawList;
        local_c8.x = (GImGui->Style).Colors[2].x;
        local_c8.y = (GImGui->Style).Colors[2].y;
        uVar7 = (GImGui->Style).Colors[2].z;
        uVar8 = (GImGui->Style).Colors[2].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar8;
        local_c8.z = (float)uVar7;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled(pIVar3,(ImVec2 *)local_b0,(ImVec2 *)(local_b0 + 8),IVar17,0.0,0xf)
        ;
        pIVar3 = pIVar16->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar20 << 4));
        local_c8._0_8_ = *puVar1;
        uVar9 = puVar1[1];
        local_c8.w = (float)((ulong)uVar9 >> 0x20);
        local_c8.z = (float)uVar9;
        local_c8.w = (GImGui->Style).Alpha * local_c8.w;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled(pIVar3,(ImVec2 *)local_a0,(ImVec2 *)(local_a0 + 8),IVar17,0.0,0xf)
        ;
        pIVar3 = pIVar16->DrawList;
        local_c8.x = (GImGui->Style).Colors[5].x;
        local_c8.y = (GImGui->Style).Colors[5].y;
        uVar10 = (GImGui->Style).Colors[5].z;
        uVar11 = (GImGui->Style).Colors[5].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar11;
        local_c8.z = (float)uVar10;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRect(pIVar3,(ImVec2 *)local_b0,(ImVec2 *)(local_b0 + 8),IVar17,0.0,0xf,1.0);
        IVar21 = local_68;
        pIVar3 = pIVar16->DrawList;
        font = *(ImFont **)((long)local_68 + 0x1978);
        local_58 = *(float *)((long)local_68 + 0x1980);
        local_c8.x = (GImGui->Style).Colors[0].x;
        local_c8.y = (GImGui->Style).Colors[0].y;
        uVar12 = (GImGui->Style).Colors[0].z;
        uVar13 = (GImGui->Style).Colors[0].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar13;
        local_c8.z = (float)uVar12;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        text_begin = this->Name;
        text_end = text_begin;
        if (text_begin != (char *)0xffffffffffffffff) {
          do {
            if (*text_end == '#') {
              if (text_end[1] == '#') goto LAB_001631d4;
            }
            else if (*text_end == '\0') goto LAB_001631d4;
            text_end = text_end + 1;
          } while (text_end != (char *)0xffffffffffffffff);
          text_end = (char *)0xffffffffffffffff;
        }
LAB_001631d4:
        ImDrawList::AddText(pIVar3,font,local_58,(ImVec2 *)local_a0,IVar17,text_begin,text_end,0.0,
                            (ImVec4 *)0x0);
      }
      uVar19 = uVar19 + 1;
      uVar18 = (ulong)(uint)((ImVector<ImGuiWindow_*> *)((long)IVar21 + 0x1a88))->Size;
    } while (uVar19 != uVar18);
  }
  local_c8.x = (GImGui->Style).Colors[5].x;
  local_c8.y = (GImGui->Style).Colors[5].y;
  uVar14 = (GImGui->Style).Colors[5].z;
  uVar15 = (GImGui->Style).Colors[5].w;
  local_c8.w = (GImGui->Style).Alpha * (float)uVar15;
  local_c8.z = (float)uVar14;
  IVar17 = ColorConvertFloat4ToU32(&local_c8);
  ImDrawList::AddRect(local_40,&local_90->Min,local_48,IVar17,0.0,0xf,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}